

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_brodnik.h
# Opt level: O0

void copy<unsigned_char*,unsigned_char**>(vector_brodnik<unsigned_char_*> *bucket,uchar **dst)

{
  uchar **__first;
  size_type sVar1;
  size_t sVar2;
  const_reference pppuVar3;
  ulong local_40;
  size_t j;
  size_t i;
  size_t blocksize;
  size_t superblocksize;
  uchar **ppuStack_18;
  bool superblock_odd;
  uchar **dst_local;
  vector_brodnik<unsigned_char_*> *bucket_local;
  
  superblocksize._7_1_ = 0;
  blocksize = 8;
  i = 8;
  j = 0;
  ppuStack_18 = dst;
  while (sVar1 = std::vector<unsigned_char_**,_std::allocator<unsigned_char_**>_>::size
                           (&bucket->_index_block), j < sVar1) {
    for (local_40 = 0; local_40 < blocksize; local_40 = local_40 + 1) {
      sVar1 = std::vector<unsigned_char_**,_std::allocator<unsigned_char_**>_>::size
                        (&bucket->_index_block);
      if (j + local_40 == sVar1 - 1) goto LAB_002d9afb;
      pppuVar3 = std::vector<unsigned_char_**,_std::allocator<unsigned_char_**>_>::operator[]
                           (&bucket->_index_block,j + local_40);
      __first = *pppuVar3;
      pppuVar3 = std::vector<unsigned_char_**,_std::allocator<unsigned_char_**>_>::operator[]
                           (&bucket->_index_block,j + local_40);
      std::copy<unsigned_char**,unsigned_char**>(__first,*pppuVar3 + i,ppuStack_18);
      ppuStack_18 = ppuStack_18 + i;
    }
    sVar2 = blocksize << superblocksize._7_1_;
    i = i << ((superblocksize._7_1_ ^ 0xff) & 1);
    superblocksize._7_1_ = (superblocksize._7_1_ ^ 0xff) & 1;
    j = blocksize + j;
    blocksize = sVar2;
  }
LAB_002d9afb:
  pppuVar3 = std::vector<unsigned_char_**,_std::allocator<unsigned_char_**>_>::back
                       (&bucket->_index_block);
  std::copy<unsigned_char**,unsigned_char**>(*pppuVar3,bucket->_insertpos,ppuStack_18);
  return;
}

Assistant:

static inline void
copy(const vector_brodnik<T>& bucket, OutputIterator dst)
{
	bool superblock_odd=(vector_brodnik<T>::InitialSuperBlock % 2 == 1);
	size_t superblocksize=vector_brodnik<T>::InitialSuperBlocksize;
	size_t blocksize=vector_brodnik<T>::InitialBlocksize;
	for (size_t i=0; i < bucket._index_block.size(); ) {
		for (size_t j=0; j < superblocksize; ++j) {
			if (i+j == (bucket._index_block.size()-1)) goto done;
			std::copy(bucket._index_block[i+j],
			          bucket._index_block[i+j]+blocksize,
			          dst);
			dst += blocksize;
		}
		i += superblocksize;
		superblocksize <<= superblock_odd;
		blocksize     <<= !superblock_odd;
		superblock_odd = !superblock_odd;
	}
done:
	std::copy(bucket._index_block.back(),
	          bucket._insertpos,
	          dst);
}